

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtrPool.h
# Opt level: O1

InstructionBegStr * __thiscall
Hpipe::PtrPool<Hpipe::Instruction,32>::operator<<
          (PtrPool<Hpipe::Instruction,32> *this,InstructionBegStr *ptr)

{
  int iVar1;
  void *pvVar2;
  
  if (*(int *)(this + 8) == 0x20) {
    pvVar2 = operator_new(0x108);
    *(undefined8 *)((long)pvVar2 + 0x100) = *(undefined8 *)this;
    *(void **)this = pvVar2;
    *(undefined4 *)(this + 8) = 0;
  }
  iVar1 = *(int *)(this + 8);
  *(int *)(this + 8) = iVar1 + 1;
  *(InstructionBegStr **)(*(long *)this + (long)iVar1 * 8) = ptr;
  return ptr;
}

Assistant:

A *operator<<( A *ptr ) {
        if ( used == s ) {
            Set *n = new Set;
            n->prev = last;
            last = n;
            used = 0;
        }
        last->items[ used++ ] = ptr;
        return ptr;
    }